

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_visuals.cxx
# Opt level: O0

void __thiscall level_tools::export_for_maya(level_tools *this,level_mesh *mesh)

{
  bool bVar1;
  uint16_t texture;
  model_type mVar2;
  b_model_vec *pbVar3;
  pointer pbVar4;
  size_t sVar5;
  reference pbVar6;
  xr_object *this_00;
  xr_mesh *this_01;
  string *this_02;
  uint32_t *puVar7;
  char *name_00;
  xr_mesh *mesh1;
  xr_object *object;
  b_model_vec_cit end;
  __normal_iterator<const_b_model_*,_std::vector<b_model,_std::allocator<b_model>_>_> local_40;
  b_model_vec_cit it;
  xr_name_gen name;
  xr_object *maya_object;
  uint16_t terrain_texture;
  level_mesh *mesh_local;
  level_tools *this_local;
  
  texture = get_terrain_texture(this);
  if (texture != 0xffff) {
    xray_re::msg("separating %s","terrain");
    level_mesh::separate_terrain(mesh,texture);
  }
  xray_re::msg("separating %s","continuous texture-joined meshes");
  level_mesh::enable_restricted_merge(mesh);
  level_mesh::create_models(mesh);
  name.m_next_idx = 0;
  name.m_offset = 0;
  xray_re::xr_name_gen::xr_name_gen((xr_name_gen *)&it,"lod",false);
  pbVar3 = level_mesh::models(mesh);
  local_40._M_current = (b_model *)std::vector<b_model,_std::allocator<b_model>_>::begin(pbVar3);
  pbVar3 = level_mesh::models(mesh);
  object = (xr_object *)std::vector<b_model,_std::allocator<b_model>_>::end(pbVar3);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&local_40,
                       (__normal_iterator<const_b_model_*,_std::vector<b_model,_std::allocator<b_model>_>_>
                        *)&object);
    if (!bVar1) {
      if (name._8_8_ != 0) {
        (**(code **)(*(long *)name._8_8_ + 0x28))();
        save_object(this,(xr_object *)name._8_8_,"cuts");
        if (name._8_8_ != 0) {
          (**(code **)(*(long *)name._8_8_ + 8))();
        }
      }
      xray_re::xr_name_gen::~xr_name_gen((xr_name_gen *)&it);
      return;
    }
    pbVar4 = __gnu_cxx::
             __normal_iterator<const_b_model_*,_std::vector<b_model,_std::allocator<b_model>_>_>::
             operator->(&local_40);
    mVar2 = b_model::type(pbVar4);
    if (mVar2 == MT_MU_MODEL) {
      if ((this->m_rflags & 1) != 0) {
        this_00 = (xr_object *)operator_new(400);
        xray_re::xr_object::xr_object(this_00,&this->super_xr_surface_factory);
        pbVar6 = __gnu_cxx::
                 __normal_iterator<const_b_model_*,_std::vector<b_model,_std::allocator<b_model>_>_>
                 ::operator*(&local_40);
        this_01 = level_mesh::commit(mesh,this_00,pbVar6,0xffffffff);
        this_02 = xray_re::xr_mesh::name_abi_cxx11_(this_01);
        std::__cxx11::string::operator=((string *)this_02,"modelShape");
        (*(this_00->super_xr_surface_factory)._vptr_xr_surface_factory[6])();
        puVar7 = xray_re::xr_object::flags(this_00);
        *puVar7 = 0x14;
        name_00 = xray_re::xr_name_gen::get((xr_name_gen *)&it);
        save_object(this,this_00,name_00);
        xray_re::xr_name_gen::next((xr_name_gen *)&it);
        if (this_00 != (xr_object *)0x0) {
          (*(this_00->super_xr_surface_factory)._vptr_xr_surface_factory[1])();
        }
      }
    }
    else {
      pbVar4 = __gnu_cxx::
               __normal_iterator<const_b_model_*,_std::vector<b_model,_std::allocator<b_model>_>_>::
               operator->(&local_40);
      sVar5 = b_model::num_instances(pbVar4);
      if (sVar5 != 1) {
        __assert_fail("it->num_instances() == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_tools_visuals.cxx"
                      ,0x284,"void level_tools::export_for_maya(level_mesh *) const");
      }
      if (name._8_8_ == 0) {
        name._8_8_ = operator_new(400);
        xray_re::xr_object::xr_object((xr_object *)name._8_8_,&this->super_xr_surface_factory);
      }
      pbVar6 = __gnu_cxx::
               __normal_iterator<const_b_model_*,_std::vector<b_model,_std::allocator<b_model>_>_>::
               operator*(&local_40);
      level_mesh::commit(mesh,(xr_object *)name._8_8_,pbVar6,0xffffffff);
    }
    __gnu_cxx::__normal_iterator<const_b_model_*,_std::vector<b_model,_std::allocator<b_model>_>_>::
    operator++(&local_40);
  } while( true );
}

Assistant:

void level_tools::export_for_maya(level_mesh* mesh) const
{
	uint16_t terrain_texture = get_terrain_texture();
	if (terrain_texture != UINT16_MAX) {
		msg("separating %s", "terrain");
		mesh->separate_terrain(terrain_texture);
	}
	msg("separating %s", "continuous texture-joined meshes");
	mesh->enable_restricted_merge();
	mesh->create_models();
	xr_object* maya_object = 0;
	xr_name_gen name("lod", false);
	for (b_model_vec_cit it = mesh->models().begin(), end = mesh->models().end();
			it != end; ++it) {
		if (it->type() != b_model::MT_MU_MODEL) {
			xr_assert(it->num_instances() == 1);
			if (maya_object == 0)
				maya_object = new xr_object(this);
			mesh->commit(*maya_object, *it);
		} else if (m_rflags & RF_WITH_LODS) {
			xr_object* object = new xr_object(this);
			xr_mesh* mesh1 = mesh->commit(*object, *it);
			mesh1->name() = "modelShape";
			object->denominate_surfaces();
			object->flags() = EOF_MULTIPLE_USAGE;
			save_object(object, name.get());
			name.next();
			delete object;
		}
	}
	if (maya_object) {
		maya_object->denominate();
		save_object(maya_object, "cuts");
		delete maya_object;
	}
}